

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lru-cache.h
# Opt level: O3

bool __thiscall
tstarling::
ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
::insert(ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
         *this,ThreadSafeStringKey *key,int *value)

{
  atomic<unsigned_long> *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar2;
  ListNode *pLVar3;
  spin_rw_mutex *psVar4;
  bool bVar5;
  spin_rw_mutex *m;
  ListNode *pLVar6;
  __int_type _Var7;
  bool bVar8;
  HashMapAccessor hashAccessor;
  unique_lock<std::mutex> lock;
  accessor local_78;
  unique_lock<std::mutex> local_58;
  value_type local_48;
  
  pLVar6 = (ListNode *)operator_new(0x20);
  local_48.first.m_storage.
  super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (key->m_storage).
       super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  (pLVar6->m_key).m_storage.
  super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_48.first.m_storage.
       super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_48.first.m_storage.
  super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (key->m_storage).
       super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  (pLVar6->m_key).m_storage.
  super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       local_48.first.m_storage.
       super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_48.first.m_storage.
      super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_48.first.m_storage.
    super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else if (__libc_single_threaded == '\0') {
    LOCK();
    (local_48.first.m_storage.
     super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_M_use_count =
         (local_48.first.m_storage.
          super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi)->_M_use_count + 1;
    UNLOCK();
    local_48.first.m_storage.
    super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (key->m_storage).
         super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_48.first.m_storage.
    super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (key->m_storage).
         super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  }
  else {
    (local_48.first.m_storage.
     super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi)->_M_use_count =
         (local_48.first.m_storage.
          super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi)->_M_use_count + 1;
  }
  pLVar6->m_prev = (ListNode *)0xffffffffffffffff;
  pLVar6->m_next = (ListNode *)0x0;
  local_78.super_const_accessor.super_scoped_type.m_mutex = (spin_rw_mutex *)0x0;
  local_78.super_const_accessor.super_scoped_type.m_is_writer = false;
  local_78.super_const_accessor.my_node = (node *)0x0;
  local_48.second.m_value = *value;
  if (local_48.first.m_storage.
      super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.first.m_storage.
       super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_48.first.m_storage.
            super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.first.m_storage.
       super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_48.first.m_storage.
            super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_48.second.m_listNode = pLVar6;
  bVar5 = tbb::detail::d2::
          concurrent_hash_map<tstarling::ThreadSafeStringKey,_tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>::HashMapValue,_tstarling::ThreadSafeStringKey::HashCompare,_tbb::detail::d1::tbb_allocator<std::pair<const_tstarling::ThreadSafeStringKey,_tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>::HashMapValue>_>_>
          ::insert(&this->m_map,&local_78,&local_48);
  psVar4 = local_78.super_const_accessor.super_scoped_type.m_mutex;
  if (bVar5) {
    if (local_78.super_const_accessor.my_node != (node *)0x0) {
      local_78.super_const_accessor.super_scoped_type.m_mutex = (spin_rw_mutex *)0x0;
      if (local_78.super_const_accessor.super_scoped_type.m_is_writer == true) {
        LOCK();
        (psVar4->m_state).super___atomic_base<long>._M_i =
             (psVar4->m_state).super___atomic_base<long>._M_i & 0xfffffffffffffffc;
        UNLOCK();
      }
      else {
        LOCK();
        (psVar4->m_state).super___atomic_base<long>._M_i =
             (psVar4->m_state).super___atomic_base<long>._M_i + -4;
        UNLOCK();
      }
      local_78.super_const_accessor.my_node = (node *)0x0;
    }
    _Var7 = (this->m_size).super___atomic_base<unsigned_long>._M_i;
    uVar2 = this->m_maxSize;
    if (uVar2 <= _Var7) {
      evict(this);
    }
    local_58._M_device = &this->m_listMutex;
    local_58._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_58);
    local_58._M_owns = true;
    pLVar3 = (this->m_head).m_next;
    pLVar6->m_prev = &this->m_head;
    pLVar6->m_next = pLVar3;
    pLVar3->m_prev = pLVar6;
    (this->m_head).m_next = pLVar6;
    std::unique_lock<std::mutex>::unlock(&local_58);
    if (_Var7 < uVar2) {
      LOCK();
      paVar1 = &this->m_size;
      _Var7 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
    }
    if (this->m_maxSize < _Var7) {
      LOCK();
      bVar8 = _Var7 == (this->m_size).super___atomic_base<unsigned_long>._M_i;
      if (bVar8) {
        (this->m_size).super___atomic_base<unsigned_long>._M_i = _Var7 - 1;
      }
      UNLOCK();
      if (bVar8) {
        evict(this);
      }
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_58);
  }
  else {
    this_00 = (pLVar6->m_key).m_storage.
              super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    operator_delete(pLVar6);
  }
  if (local_48.first.m_storage.
      super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.first.m_storage.
               super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_78.super_const_accessor.super_scoped_type.m_mutex != (spin_rw_mutex *)0x0) {
    if (local_78.super_const_accessor.super_scoped_type.m_is_writer == true) {
      LOCK();
      ((local_78.super_const_accessor.super_scoped_type.m_mutex)->m_state).super___atomic_base<long>
      ._M_i = ((local_78.super_const_accessor.super_scoped_type.m_mutex)->m_state).
              super___atomic_base<long>._M_i & 0xfffffffffffffffc;
      UNLOCK();
    }
    else {
      LOCK();
      ((local_78.super_const_accessor.super_scoped_type.m_mutex)->m_state).super___atomic_base<long>
      ._M_i = ((local_78.super_const_accessor.super_scoped_type.m_mutex)->m_state).
              super___atomic_base<long>._M_i + -4;
      UNLOCK();
    }
  }
  return bVar5;
}

Assistant:

bool ThreadSafeLRUCache<TKey, TValue, THash>::
insert(const TKey& key, const TValue& value) {
  // Insert into the CHM
  ListNode* node = new ListNode(key);
  HashMapAccessor hashAccessor;
  HashMapValuePair hashMapValue(key, HashMapValue(value, node));
  if (!m_map.insert(hashAccessor, hashMapValue)) {
    delete node;
    return false;
  }
  hashAccessor.release();

  // Evict if necessary, now that we know the hashmap insertion was successful.
  size_t size = m_size.load();
  bool evictionDone = false;
  if (size >= m_maxSize) {
    // The container is at (or over) capacity, so eviction needs to be done.
    // Do not decrement m_size, since that would cause other threads to
    // inappropriately omit eviction during their own inserts.
    evict();
    evictionDone = true;
  }

  // Note that we have to update the LRU list before we increment m_size, so
  // that other threads don't attempt to evict list items before they even
  // exist.
  std::unique_lock<ListMutex> lock(m_listMutex);
  pushFront(node);
  lock.unlock();
  if (!evictionDone) {
    size = m_size++;
  }
  if (size > m_maxSize) {
    // It is possible for the size to temporarily exceed the maximum if there is
    // a heavy insert() load, once only as the cache fills. In this situation,
    // we have to be careful not to have every thread simultaneously attempt to
    // evict the extra entries, since we could end up underfilled. Instead we do
    // a compare-and-exchange to acquire an exclusive right to reduce the size
    // to a particular value.
    //
    // We could continue to evict in a loop, but if there are a lot of threads
    // here at the same time, that could lead to spinning. So we will just evict
    // one extra element per insert() until the overfill is rectified.
    if (m_size.compare_exchange_strong(size, size - 1)) {
      evict();
    }
  }
  return true;
}